

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O2

mraa_uart_context mraa_uart_init(int index)

{
  _func_mraa_result_t_int *p_Var1;
  _func_mraa_result_t_mraa_uart_context *p_Var2;
  int __pri;
  mraa_boolean_t mVar3;
  mraa_result_t mVar4;
  mraa_uart_context __ptr;
  long lVar5;
  long lVar6;
  char *__fmt;
  mraa_pin_t *pmVar7;
  int *piVar8;
  undefined1 *puVar9;
  byte bVar10;
  mraa_pin_t in_stack_ffffffffffffff08;
  int local_88 [26];
  
  bVar10 = 0;
  if (plat == (mraa_board_t *)0x0) {
    __fmt = "uart%i: init: platform not initialised";
  }
  else {
    mVar3 = mraa_is_sub_platform_id(index);
    if (mVar3 != 0) {
      __fmt = "uart%i: init: Using sub platform is not supported";
      __pri = 5;
      goto LAB_0010ef26;
    }
    if (((plat->adv_func == (mraa_adv_func_t *)0x0) ||
        (p_Var1 = plat->adv_func->uart_init_pre, p_Var1 == (_func_mraa_result_t_int *)0x0)) ||
       (mVar4 = (*p_Var1)(index), mVar4 == MRAA_SUCCESS)) {
      if (plat->uart_dev_count == 0) {
        __fmt = "uart%i: init: platform has no UARTs defined";
      }
      else {
        if (plat->uart_dev_count <= index) {
          syslog(3,"uart%i: init: platform has only %i uarts",index);
          return (mraa_uart_context)0x0;
        }
        if (plat->no_bus_mux != 0) goto LAB_0010ef8b;
        lVar6 = (long)plat->uart_dev[index].rx;
        if ((-1 < lVar6) && (plat->pins[lVar6].uart.mux_total != 0)) {
          pmVar7 = &plat->pins[lVar6].uart;
          piVar8 = local_88;
          for (lVar5 = 0x19; lVar5 != 0; lVar5 = lVar5 + -1) {
            *piVar8 = pmVar7->pinmap;
            pmVar7 = (mraa_pin_t *)((long)pmVar7 + (ulong)bVar10 * -8 + 4);
            piVar8 = piVar8 + (ulong)bVar10 * -2 + 1;
          }
          piVar8 = local_88;
          puVar9 = &stack0xffffffffffffff08;
          for (lVar6 = 100; lVar6 != 0; lVar6 = lVar6 + -1) {
            *puVar9 = (char)*piVar8;
            piVar8 = (int *)((long)piVar8 + (ulong)bVar10 * -2 + 1);
            puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
          }
          mVar4 = mraa_setup_mux_mapped(in_stack_ffffffffffffff08);
          if (mVar4 != MRAA_SUCCESS) {
            __fmt = "uart%i: init: failed to setup muxes for RX pin";
            goto LAB_0010ef21;
          }
        }
        lVar6 = (long)plat->uart_dev[index].tx;
        if ((lVar6 < 0) || (plat->pins[lVar6].uart.mux_total == 0)) {
LAB_0010ef8b:
          __ptr = mraa_uart_init_raw(plat->uart_dev[index].device_path);
          if (__ptr != (mraa_uart_context)0x0) {
            __ptr->index = index;
            if (__ptr->advance_func == (mraa_adv_func_t *)0x0) {
              return __ptr;
            }
            p_Var2 = __ptr->advance_func->uart_init_post;
            if (p_Var2 == (_func_mraa_result_t_mraa_uart_context *)0x0) {
              return __ptr;
            }
            mVar4 = (*p_Var2)(__ptr);
            if (mVar4 == MRAA_SUCCESS) {
              return __ptr;
            }
            free(__ptr);
          }
          return (mraa_uart_context)0x0;
        }
        pmVar7 = &plat->pins[lVar6].uart;
        piVar8 = local_88;
        for (lVar5 = 0x19; lVar5 != 0; lVar5 = lVar5 + -1) {
          *piVar8 = pmVar7->pinmap;
          pmVar7 = (mraa_pin_t *)((long)pmVar7 + (ulong)bVar10 * -8 + 4);
          piVar8 = piVar8 + (ulong)bVar10 * -2 + 1;
        }
        piVar8 = local_88;
        puVar9 = &stack0xffffffffffffff08;
        for (lVar6 = 100; lVar6 != 0; lVar6 = lVar6 + -1) {
          *puVar9 = (char)*piVar8;
          piVar8 = (int *)((long)piVar8 + (ulong)bVar10 * -2 + 1);
          puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
        }
        mVar4 = mraa_setup_mux_mapped(in_stack_ffffffffffffff08);
        if (mVar4 == MRAA_SUCCESS) goto LAB_0010ef8b;
        __fmt = "uart%i: init: failed to setup muxes for TX pin";
      }
    }
    else {
      __fmt = "uart%i: init: failure in pre-init platform hook";
    }
  }
LAB_0010ef21:
  __pri = 3;
LAB_0010ef26:
  syslog(__pri,__fmt,index);
  return (mraa_uart_context)0x0;
}

Assistant:

mraa_uart_context
mraa_uart_init(int index)
{
    if (plat == NULL) {
        syslog(LOG_ERR, "uart%i: init: platform not initialised", index);
        return NULL;
    }

    if (mraa_is_sub_platform_id(index)) {
        syslog(LOG_NOTICE, "uart%i: init: Using sub platform is not supported", index);
        return NULL;
    }

    if (plat->adv_func != NULL && plat->adv_func->uart_init_pre != NULL) {
        if (plat->adv_func->uart_init_pre(index) != MRAA_SUCCESS) {
            syslog(LOG_ERR, "uart%i: init: failure in pre-init platform hook", index);
            return NULL;
        }
    }

    if (plat->uart_dev_count == 0) {
        syslog(LOG_ERR, "uart%i: init: platform has no UARTs defined", index);
        return NULL;
    }

    if (plat->uart_dev_count <= index) {
        syslog(LOG_ERR, "uart%i: init: platform has only %i uarts", index, plat->uart_dev_count);
        return NULL;
    }

    if (!plat->no_bus_mux) {
        int pos = plat->uart_dev[index].rx;
        if (pos >= 0) {
            if (plat->pins[pos].uart.mux_total > 0) {
                if (mraa_setup_mux_mapped(plat->pins[pos].uart) != MRAA_SUCCESS) {
                    syslog(LOG_ERR, "uart%i: init: failed to setup muxes for RX pin", index);
                    return NULL;
                }
            }
        }

        pos = plat->uart_dev[index].tx;
        if (pos >= 0) {
            if (plat->pins[pos].uart.mux_total > 0) {
                if (mraa_setup_mux_mapped(plat->pins[pos].uart) != MRAA_SUCCESS) {
                    syslog(LOG_ERR, "uart%i: init: failed to setup muxes for TX pin", index);
                    return NULL;
                }
            }
        }
    }

    mraa_uart_context dev = mraa_uart_init_raw((char*)plat->uart_dev[index].device_path);
    if (dev == NULL) {
        return NULL;
    }
    dev->index = index; //Set the board Index.

    if (IS_FUNC_DEFINED(dev, uart_init_post)) {
        mraa_result_t ret = dev->advance_func->uart_init_post(dev);
        if (ret != MRAA_SUCCESS) {
            free(dev);
            return NULL;
        }
    }

    return dev;
}